

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-a64.c
# Opt level: O2

void disas_crypto_xar(DisasContext_conflict1 *s,uint32_t insn)

{
  TCGContext_conflict1 *tcg_ctx;
  TCGv_i64 ret;
  _Bool _Var1;
  TCGv_i64 tcg_dest;
  TCGv_i64 tcg_dest_00;
  TCGv_i64 tcg_src;
  TCGv_i64 tcg_src_00;
  uintptr_t o;
  long lVar2;
  uintptr_t o_1;
  TCGv_i64 tcg_res [2];
  
  if ((s->isar->id_aa64isar0 & 0xf00000000) == 0) {
    unallocated_encoding_aarch64(s);
    return;
  }
  tcg_ctx = s->uc->tcg_ctx;
  _Var1 = fp_access_check(s);
  if (_Var1) {
    tcg_dest = tcg_temp_new_i64(tcg_ctx);
    tcg_dest_00 = tcg_temp_new_i64(tcg_ctx);
    tcg_src = tcg_temp_new_i64(tcg_ctx);
    tcg_res[0] = tcg_src;
    tcg_src_00 = tcg_temp_new_i64(tcg_ctx);
    tcg_res[1] = tcg_src_00;
    for (lVar2 = 0; lVar2 != 2; lVar2 = lVar2 + 1) {
      read_vec_element(s,tcg_dest,insn >> 5 & 0x1f,(int)lVar2,MO_64);
      read_vec_element(s,tcg_dest_00,insn >> 0x10 & 0x1f,(int)lVar2,MO_64);
      ret = tcg_res[lVar2];
      tcg_gen_xor_i64_aarch64(tcg_ctx,ret,tcg_dest,tcg_dest_00);
      tcg_gen_rotri_i64_aarch64(tcg_ctx,ret,ret,insn >> 10 & 0x3f);
    }
    write_vec_element(s,tcg_src,insn & 0x1f,0,MO_64);
    write_vec_element(s,tcg_src_00,insn & 0x1f,1,MO_64);
    tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(tcg_dest + (long)tcg_ctx));
    tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(tcg_dest_00 + (long)tcg_ctx));
    tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(tcg_src + (long)tcg_ctx));
    tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(tcg_src_00 + (long)tcg_ctx));
    return;
  }
  return;
}

Assistant:

static void disas_crypto_xar(DisasContext *s, uint32_t insn)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    int rm = extract32(insn, 16, 5);
    int imm6 = extract32(insn, 10, 6);
    int rn = extract32(insn, 5, 5);
    int rd = extract32(insn, 0, 5);
    TCGv_i64 tcg_op1, tcg_op2, tcg_res[2];
    int pass;

    if (!dc_isar_feature(aa64_sha3, s)) {
        unallocated_encoding(s);
        return;
    }

    if (!fp_access_check(s)) {
        return;
    }

    tcg_op1 = tcg_temp_new_i64(tcg_ctx);
    tcg_op2 = tcg_temp_new_i64(tcg_ctx);
    tcg_res[0] = tcg_temp_new_i64(tcg_ctx);
    tcg_res[1] = tcg_temp_new_i64(tcg_ctx);

    for (pass = 0; pass < 2; pass++) {
        read_vec_element(s, tcg_op1, rn, pass, MO_64);
        read_vec_element(s, tcg_op2, rm, pass, MO_64);

        tcg_gen_xor_i64(tcg_ctx, tcg_res[pass], tcg_op1, tcg_op2);
        tcg_gen_rotri_i64(tcg_ctx, tcg_res[pass], tcg_res[pass], imm6);
    }
    write_vec_element(s, tcg_res[0], rd, 0, MO_64);
    write_vec_element(s, tcg_res[1], rd, 1, MO_64);

    tcg_temp_free_i64(tcg_ctx, tcg_op1);
    tcg_temp_free_i64(tcg_ctx, tcg_op2);
    tcg_temp_free_i64(tcg_ctx, tcg_res[0]);
    tcg_temp_free_i64(tcg_ctx, tcg_res[1]);
}